

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O2

void __thiscall Clasp::CBConsequences::QueryFinder::initUpper(QueryFinder *this,Solver *s)

{
  uint uVar1;
  Literal p;
  uint uVar2;
  pointer pLVar3;
  State *this_00;
  byte bVar4;
  long lVar5;
  pointer first;
  
  pLVar3 = (this->open_).ebo_.buf;
  uVar1 = (this->open_).ebo_.size;
  first = pLVar3;
  for (lVar5 = 0; (ulong)uVar1 << 2 != lVar5; lVar5 = lVar5 + 4) {
    p.rep_ = *(uint32 *)((long)&pLVar3->rep_ + lVar5);
    uVar2 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
    bVar4 = (byte)uVar2 & 3;
    if (bVar4 == (byte)(2U - ((p.rep_ & 2) == 0))) {
      this_00 = this->state_;
      if (uVar2 < 0x10) {
        LOCK();
        this_00->value_[p.rep_ >> 2].super___atomic_base<unsigned_char>._M_i = bVar4;
        UNLOCK();
      }
      else {
        first->rep_ = p.rep_;
        first = first + 1;
        State::push(this_00,p);
      }
    }
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
            (&this->open_,first,(this->open_).ebo_.buf + (this->open_).ebo_.size);
  return;
}

Assistant:

void CBConsequences::QueryFinder::initUpper(Solver& s) {
	LitVec::iterator j = open_.begin();
	for (LitVec::iterator it = j, end = open_.end(); it != end; ++it) {
		if (s.isTrue(*it)) {
			if (s.level(it->var())) { state_->push(*j++ = *it); }
			else                    { state_->fix(*it); }
		}
	}
	open_.erase(j, open_.end());
}